

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.h
# Opt level: O2

void __thiscall rengine::AnimationManager::~AnimationManager(AnimationManager *this)

{
  (this->super_SignalEmitter)._vptr_SignalEmitter = (_func_int **)&PTR__AnimationManager_0012d970;
  std::__cxx11::
  _List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
  ::_M_clear(&(this->m_scheduledAnimations).
              super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
            );
  std::__cxx11::
  _List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
  ::_M_clear(&(this->m_runningAnimations).
              super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
            );
  SignalEmitter::~SignalEmitter(&this->super_SignalEmitter);
  return;
}

Assistant:

AnimationManager()
    {
    }